

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O1

void __thiscall cali::Blackboard::snapshot(Blackboard *this,SnapshotBuilder *rec)

{
  undefined8 *puVar1;
  ulong uVar2;
  Entry *pEVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  for (uVar7 = this->toctoc; uVar7 != 0; uVar7 = uVar7 & ~(1 << (uVar4 & 0x1f))) {
    uVar4 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    uVar8 = this->toc[uVar4];
    if (uVar8 != 0) {
      do {
        uVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar2 = rec->m_len;
        if (uVar2 < rec->m_capacity) {
          uVar9 = (ulong)((uVar5 | uVar4 << 5) << 5);
          pEVar3 = rec->m_data;
          rec->m_len = uVar2 + 1;
          pEVar3[uVar2].m_value.m_v.value =
               *(anon_union_8_7_33918203_for_value *)
                ((long)&this->hashtable[0].value.m_value.m_v.value + uVar9);
          puVar1 = (undefined8 *)((long)&this->hashtable[0].value.m_node + uVar9);
          uVar6 = puVar1[1];
          pEVar3 = pEVar3 + uVar2;
          pEVar3->m_node = (Node *)*puVar1;
          (pEVar3->m_value).m_v.type_and_size = uVar6;
        }
        else {
          rec->m_skipped = rec->m_skipped + 1;
        }
        uVar8 = uVar8 & ~(1 << (uVar5 & 0x1f));
      } while (uVar8 != 0);
    }
  }
  return;
}

Assistant:

void Blackboard::snapshot(SnapshotBuilder& rec) const
{
    int tmptoc = toctoc;

    while (tmptoc) {
        int i = first_high_bit(tmptoc) - 1;
        tmptoc &= ~(1 << i);

        int tmp = toc[i];
        while (tmp) {
            int j = first_high_bit(tmp) - 1;
            tmp &= ~(1 << j);

            rec.append(hashtable[i * 32 + j].value);
        }
    }
}